

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O1

void * __thiscall
xercesc_4_0::DOMDocumentImpl::getUserData(DOMDocumentImpl *this,DOMNodeImpl *n,XMLCh *key)

{
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher> *pRVar1;
  bool bVar2;
  ulong uVar3;
  PoolElem *pPVar4;
  RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
  *pRVar5;
  uint uVar6;
  XMLCh *pXVar7;
  RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
  *pRVar8;
  XMLCh XVar9;
  RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *pRVar10;
  
  if (this->fUserDataTable !=
      (RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
       *)0x0) {
    pRVar1 = (this->fUserDataTableKeys).fHashTable;
    if ((key == (XMLCh *)0x0) || (uVar3 = (ulong)(ushort)*key, uVar3 == 0)) {
      uVar3 = 0;
    }
    else {
      XVar9 = key[1];
      if (XVar9 != L'\0') {
        pXVar7 = key + 2;
        do {
          uVar3 = (ulong)(ushort)XVar9 + (uVar3 >> 0x18) + uVar3 * 0x26;
          XVar9 = *pXVar7;
          pXVar7 = pXVar7 + 1;
        } while (XVar9 != L'\0');
      }
      uVar3 = uVar3 % pRVar1->fHashModulus;
    }
    pRVar10 = pRVar1->fBucketList[uVar3];
    if (pRVar10 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
      do {
        bVar2 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,key,pRVar10->fKey);
        if (bVar2) goto LAB_0026caf9;
        pRVar10 = pRVar10->fNext;
      } while (pRVar10 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0);
    }
    pRVar10 = (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
LAB_0026caf9:
    uVar6 = 0;
    if (pRVar10 == (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
      pPVar4 = (PoolElem *)0x0;
    }
    else {
      pPVar4 = pRVar10->fData;
    }
    if (pPVar4 != (PoolElem *)0x0) {
      uVar6 = pPVar4->fId;
    }
    if (uVar6 == 0) {
      bVar2 = true;
    }
    else {
      pRVar5 = this->fUserDataTable->fBucketList[(ulong)n % this->fUserDataTable->fHashModulus];
      pRVar8 = (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
                *)0x0;
      if (pRVar5 != (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
                     *)0x0) {
        do {
          if ((pRVar5->fKey2 == uVar6) && (pRVar8 = pRVar5, (DOMNodeImpl *)pRVar5->fKey1 == n))
          break;
          pRVar5 = pRVar5->fNext;
          pRVar8 = (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
                    *)0x0;
        } while (pRVar5 != (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
                            *)0x0);
      }
      if (pRVar8 == (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
                     *)0x0) {
        pPVar4 = (PoolElem *)0x0;
      }
      else {
        pPVar4 = (PoolElem *)pRVar8->fData;
      }
      bVar2 = pPVar4 == (PoolElem *)0x0;
      if (!bVar2) {
        pPVar4 = *(PoolElem **)pPVar4;
      }
    }
    if (!bVar2) {
      return pPVar4;
    }
  }
  return (void *)0x0;
}

Assistant:

void* DOMDocumentImpl::getUserData(const DOMNodeImpl* n, const XMLCh* key) const
{
    if (fUserDataTable) {
        unsigned int keyId=fUserDataTableKeys.getId(key);
        if(keyId!=0) {
            DOMUserDataRecord* dataRecord = fUserDataTable->get((void*)n, keyId);
            if (dataRecord)
                return dataRecord->getKey();
        }
    }

    return 0;
}